

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOAddScalarArray(FmsIOContext *ctx,char *path,FmsScalarType type,void *values,FmsInt n)

{
  long in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ulong in_R8;
  double *v_3;
  float *v_2;
  double *v_1;
  float *v;
  uint epl;
  int retval;
  size_t j;
  size_t i;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  if ((in_EDX == 2) || (local_30 = in_R8, in_EDX == 2)) {
    local_30 = in_R8 << 1;
  }
  fprintf((FILE *)*in_RDI,"%s/Size: %lu\n",in_RSI,local_30);
  fprintf((FILE *)*in_RDI,"%s/Type: %s\n",in_RSI,FmsScalarTypeNames[in_EDX]);
  switch(in_EDX) {
  case 0:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < local_30) {
      for (local_40 = 0; local_40 < 3 && local_38 < local_30; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%f",(double)*(float *)(in_RCX + local_38 * 4));
        if (local_38 < local_30 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < local_30 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 1:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < local_30) {
      for (local_40 = 0; local_40 < 3 && local_38 < local_30; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%f",*(undefined8 *)(in_RCX + local_38 * 8));
        if (local_38 < local_30 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < local_30 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 2:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < local_30) {
      for (local_40 = 0; local_40 < 3 && local_38 < local_30; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%f",(double)*(float *)(in_RCX + local_38 * 4));
        if (local_38 < local_30 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < local_30 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 3:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < local_30) {
      for (local_40 = 0; local_40 < 3 && local_38 < local_30; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%f",*(undefined8 *)(in_RCX + local_38 * 8));
        if (local_38 < local_30 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < local_30 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  default:
    return 1;
  }
  return 0;
}

Assistant:

static int
FmsIOAddScalarArray(FmsIOContext *ctx, const char *path, FmsScalarType type,
                    const void *values, FmsInt n) {
  /* Shall we stick some type information into the ASCII to preserve the intended IntType? */
  size_t i, j;
  int retval = 0;
  const unsigned int epl = FMS_ELE_PER_LINE;

  if(type == FMS_COMPLEX_FLOAT || type == FMS_COMPLEX_FLOAT)
    n = n * 2;

  fprintf(ctx->fp, "%s/Size: " FMS_LU "\n", path, n);
  fprintf(ctx->fp, "%s/Type: %s\n", path, FmsScalarTypeNames[type]);

#define PRINT_MACRO(typename, T, format)    \
    do {                                    \
    const T *v = (const T *)(values);       \
    fprintf(ctx->fp, "%s/Values: [", path); \
    for(i = 0; i < n;) {                    \
        for(j = 0; j < epl && i < n; j++, i++) { \
            fprintf(ctx->fp, format, v[i]); \
            if(i < n-1)                     \
                fprintf(ctx->fp, ", ");     \
        }                                   \
        if(i < n-1)                         \
            fprintf(ctx->fp, "\n");         \
    }                                       \
    fprintf(ctx->fp, "]\n");                \
    } while(0)

  switch(type) {
#define CASES(typename, T, format)          \
        case typename:                          \
            PRINT_MACRO(typename, T, format);   \
            break;
    FOR_EACH_SCALAR_TYPE(CASES)
#undef CASES
  default:
    E_RETURN(1);
    break;
  }
#undef PRINT_MACRO
  return retval;
}